

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::update<true,false,true,true,false,0ul,0ul,0ul>(gd *g,base_learner *param_2,example *ec)

{
  double *pdVar1;
  long in_RDI;
  float fVar2;
  example *in_stack_00000008;
  float update;
  vw *in_stack_00000060;
  example *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  fVar2 = compute_update<true,false,true,true,false,0ul,0ul,0ul>((gd *)ec,in_stack_00000008);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    train<true,true,0ul,0ul,0ul>
              ((gd *)CONCAT44(fVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,0.0);
  }
  pdVar1 = (double *)(**(long **)(in_RDI + 0x60) + 0x60);
  if ((*pdVar1 <= 1e-09 && *pdVar1 != 1e-09) ||
     (1000.0 < *(double *)(**(long **)(in_RDI + 0x60) + 0x58))) {
    sync_weights(in_stack_00000060);
  }
  return;
}

Assistant:

void update(gd& g, base_learner&, example& ec)
{
  // invariant: not a test label, importance weight > 0
  float update;
  if ((update = compute_update<sparse_l2, invariant, sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare>(
           g, ec)) != 0.)
    train<sqrt_rate, feature_mask_off, adaptive, normalized, spare>(g, ec, update);

  if (g.all->sd->contraction < 1e-9 || g.all->sd->gravity > 1e3)  // updating weights now to avoid numerical instability
    sync_weights(*g.all);
}